

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

Ref __thiscall
anon_unknown.dwarf_b296a::AssertionEmitter::emitInvokeFunc
          (AssertionEmitter *this,InvokeAction *invoke,Module *wasm,Name testFuncName,Name asmModule
          )

{
  pointer func;
  Ref asmjs;
  Name name;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_d8;
  uintptr_t local_c0;
  Type local_a8;
  Signature local_a0;
  HeapType local_90;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_88;
  char *local_68;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *pvStack_60;
  Builder local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_48;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> testFunc;
  Expression *body;
  Module *wasm_local;
  InvokeAction *invoke_local;
  AssertionEmitter *this_local;
  Name testFuncName_local;
  Ref jsFunc;
  
  testFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       translateInvoke(this,invoke,wasm);
  ::wasm::Builder::Builder(&local_50,wasm);
  local_88.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = testFuncName.super_IString.str._M_len;
  pvStack_60 = testFuncName.super_IString.str._M_str;
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector(&local_88);
  ::wasm::Type::Type(&local_a8,none);
  local_c0 = *(uintptr_t *)
              ((long)testFunc._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
  ::wasm::Signature::Signature(&local_a0,local_a8,(Type)local_c0);
  ::wasm::HeapType::HeapType(&local_90,local_a0);
  local_d8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector(&local_d8);
  name.super_IString.str._M_str = local_68;
  name.super_IString.str._M_len = (size_t)&local_48;
  ::wasm::Builder::makeFunction
            (name,pvStack_60,(HeapType)&local_88,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_90.id,
             (Expression *)&local_d8);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector(&local_d8);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector(&local_88);
  func = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_48);
  asmjs = processFunction(this,func);
  fixCalls(this,asmjs,asmModule);
  emitFunction(this,asmjs);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_48);
  return (Ref)asmjs.inst;
}

Assistant:

Ref AssertionEmitter::emitInvokeFunc(InvokeAction& invoke,
                                     Module& wasm,
                                     Name testFuncName,
                                     Name asmModule) {
  Expression* body = translateInvoke(invoke, wasm);
  std::unique_ptr<Function> testFunc(
    Builder(wasm).makeFunction(testFuncName,
                               std::vector<NameType>{},
                               Signature(Type::none, body->type),
                               std::vector<NameType>{},
                               body));
  Ref jsFunc = processFunction(testFunc.get());
  fixCalls(jsFunc, asmModule);
  emitFunction(jsFunc);
  return jsFunc;
}